

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nes_apu.c
# Opt level: O2

void * device_start_nesapu(UINT32 clock,UINT32 rate)

{
  uint uVar1;
  void *pvVar2;
  nesapu_state *info;
  int i_1;
  uint uVar3;
  long lVar4;
  uint uVar5;
  
  pvVar2 = calloc(1,0x43f0);
  if (pvVar2 != (void *)0x0) {
    uVar1 = rate / 0x3c;
    *(uint *)((long)pvVar2 + 0xe4) = uVar1;
    *(uint *)((long)pvVar2 + 0xec) = uVar1 * 0x3c;
    *(float *)((long)pvVar2 + 0xe0) = (float)clock / (float)(uVar1 * 0x3c);
    uVar3 = 0x11;
    for (lVar4 = 0; lVar4 != 0x4000; lVar4 = lVar4 + 1) {
      uVar5 = (int)uVar3 >> 1;
      uVar3 = ((uVar3 ^ uVar5) & 1) << 0xc | uVar5;
      *(char *)((long)pvVar2 + lVar4 + 0xf0) = (char)uVar5;
    }
    for (lVar4 = 0; lVar4 != 0x20; lVar4 = lVar4 + 1) {
      *(uint *)((long)pvVar2 + lVar4 * 4 + 0x40f0) =
           "\x05\x7f\n\x01\x13\x02(\x03P\x04\x1e\x05\a\x06\r\a\x06\b\f\t\x18\n0\v`\f$\r\b\x0e\x10\x0f"
           [lVar4] * uVar1;
    }
    uVar3 = uVar1;
    for (lVar4 = 0; lVar4 != 0x20; lVar4 = lVar4 + 1) {
      *(uint *)((long)pvVar2 + lVar4 * 4 + 0x4170) = uVar3;
      uVar3 = uVar3 + uVar1;
    }
    uVar3 = 0;
    for (lVar4 = 0; lVar4 != 0x80; lVar4 = lVar4 + 1) {
      *(uint *)((long)pvVar2 + lVar4 * 4 + 0x41f0) = uVar3 >> 2;
      uVar3 = uVar3 + uVar1;
    }
    *(uint *)((long)pvVar2 + 0xe8) = uVar1 * 2;
    *(undefined8 *)((long)pvVar2 + 0xa0) = 0;
    *(undefined1 *)((long)pvVar2 + 0x27) = 0;
    *(undefined1 *)((long)pvVar2 + 0x47) = 0;
    *(undefined1 *)((long)pvVar2 + 99) = 0;
    *(undefined1 *)((long)pvVar2 + 0x7e) = 0;
    *(undefined1 *)((long)pvVar2 + 0xaa) = 0;
  }
  return pvVar2;
}

Assistant:

void* device_start_nesapu(UINT32 clock, UINT32 rate)
{
	nesapu_state *info;

	info = (nesapu_state*)calloc(1, sizeof(nesapu_state));
	if (info == NULL)
		return NULL;
	
	/* Initialize global variables */
	info->samps_per_sync = rate / SCREEN_HZ;
	info->buffer_size = info->samps_per_sync;
	info->real_rate = info->samps_per_sync * SCREEN_HZ;
	info->apu_incsize = (float) (clock / (float) info->real_rate);

	/* Use initializer calls */
	create_noise(info->noise_lut, 13, NOISE_LONG);
	create_vbltimes(info->vbl_times,vbl_length,info->samps_per_sync);
	create_syncs(info, info->samps_per_sync);

	/* Adjust buffer size if 16 bits */
	info->buffer_size+=info->samps_per_sync;

	info->APU.dpcm.memory = NULL;

	nesapu_set_mute_mask(info, 0x00);

	return info;
}